

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::relocate
          (QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *this,qsizetype offset,
          _Rb_tree_const_iterator<Node<Include>_> **data)

{
  _Rb_tree_const_iterator<Node<Include>_> *d_first;
  _Rb_tree_const_iterator<Node<Include>_> *p_Var1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<std::_Rb_tree_const_iterator<Node<Include>>,long_long>
            (this->ptr,this->size,d_first);
  if (data != (_Rb_tree_const_iterator<Node<Include>_> **)0x0) {
    p_Var1 = *data;
    if ((this->ptr <= p_Var1) && (p_Var1 < this->ptr + this->size)) {
      *data = p_Var1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }